

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderArrowPointingAt
               (ImDrawList *draw_list,ImVec2 pos,ImVec2 half_sz,ImGuiDir direction,ImU32 col)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  ImVec2 *p1;
  int in_ESI;
  ImVec2 *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined8 in_stack_ffffffffffffff80;
  ImU32 col_00;
  ImVec2 *in_stack_ffffffffffffff88;
  ImVec2 *in_stack_ffffffffffffff90;
  ImVec2 in_stack_ffffffffffffffa0;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28 [3];
  undefined8 local_10;
  undefined8 local_8;
  
  uVar1 = vmovlpd_avx(in_ZMM0._0_16_);
  uVar2 = vmovlpd_avx(in_ZMM1._0_16_);
  p1 = (ImVec2 *)(ulong)(in_ESI + 1);
  local_8._0_4_ = (float)uVar1;
  local_8._4_4_ = (float)((ulong)uVar1 >> 0x20);
  local_10._0_4_ = (float)uVar2;
  local_10._4_4_ = (float)((ulong)uVar2 >> 0x20);
  col_00 = (ImU32)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  local_10 = uVar2;
  local_8 = uVar1;
  switch(p1) {
  case (ImVec2 *)0x0:
  case (ImVec2 *)0x5:
    break;
  case (ImVec2 *)0x1:
    fVar3 = (float)local_8 + (float)local_10;
    fVar4 = local_8._4_4_ - local_10._4_4_;
    ImVec2::ImVec2(local_28,fVar3,fVar4);
    ImVec2::ImVec2(&local_30,(float)local_8 + (float)local_10,local_8._4_4_ + local_10._4_4_);
    ImDrawList::AddTriangleFilled
              ((ImDrawList *)in_stack_ffffffffffffffa0,p1,in_RDI,in_stack_ffffffffffffff88,col_00);
    break;
  case (ImVec2 *)0x2:
    fVar4 = (float)local_8 - (float)local_10;
    fVar3 = local_8._4_4_ + local_10._4_4_;
    ImVec2::ImVec2(&local_38,fVar4,fVar3);
    ImVec2::ImVec2(&local_40,(float)local_8 - (float)local_10,local_8._4_4_ - local_10._4_4_);
    ImDrawList::AddTriangleFilled
              ((ImDrawList *)in_stack_ffffffffffffffa0,p1,in_stack_ffffffffffffff90,in_RDI,col_00);
    break;
  case (ImVec2 *)0x3:
    fVar3 = (float)local_8 + (float)local_10;
    fVar4 = local_8._4_4_ + local_10._4_4_;
    ImVec2::ImVec2(&local_48,fVar3,fVar4);
    ImVec2::ImVec2(&local_50,(float)local_8 - (float)local_10,local_8._4_4_ + local_10._4_4_);
    ImDrawList::AddTriangleFilled
              ((ImDrawList *)in_stack_ffffffffffffffa0,p1,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88,(ImU32)((ulong)in_RDI >> 0x20));
    break;
  case (ImVec2 *)0x4:
    fVar3 = (float)local_8 - (float)local_10;
    fVar4 = local_8._4_4_ - local_10._4_4_;
    ImVec2::ImVec2(&local_58,fVar3,fVar4);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa0,(float)local_8 + (float)local_10,
                   local_8._4_4_ - local_10._4_4_);
    ImDrawList::AddTriangleFilled
              ((ImDrawList *)in_stack_ffffffffffffffa0,p1,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88,col_00);
  }
  return;
}

Assistant:

void ImGui::RenderArrowPointingAt(ImDrawList* draw_list, ImVec2 pos, ImVec2 half_sz, ImGuiDir direction, ImU32 col)
{
    switch (direction)
    {
    case ImGuiDir_Left:  draw_list->AddTriangleFilled(ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), ImVec2(pos.x + half_sz.x, pos.y + half_sz.y), pos, col); return;
    case ImGuiDir_Right: draw_list->AddTriangleFilled(ImVec2(pos.x - half_sz.x, pos.y + half_sz.y), ImVec2(pos.x - half_sz.x, pos.y - half_sz.y), pos, col); return;
    case ImGuiDir_Up:    draw_list->AddTriangleFilled(ImVec2(pos.x + half_sz.x, pos.y + half_sz.y), ImVec2(pos.x - half_sz.x, pos.y + half_sz.y), pos, col); return;
    case ImGuiDir_Down:  draw_list->AddTriangleFilled(ImVec2(pos.x - half_sz.x, pos.y - half_sz.y), ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), pos, col); return;
    case ImGuiDir_None: case ImGuiDir_COUNT: break; // Fix warnings
    }
}